

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

ExprTree * __thiscall
PcodeCompile::createOpOut
          (PcodeCompile *this,VarnodeTpl *outvn,OpCode opc,ExprTree *vn1,ExprTree *vn2)

{
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar1;
  pointer ppOVar2;
  OpTpl *this_00;
  VarnodeTpl *this_01;
  OpTpl *op;
  
  std::vector<OpTpl*,std::allocator<OpTpl*>>::
  insert<__gnu_cxx::__normal_iterator<OpTpl**,std::vector<OpTpl*,std::allocator<OpTpl*>>>,void>
            ((vector<OpTpl*,std::allocator<OpTpl*>> *)vn1->ops,
             (const_iterator)*(OpTpl ***)((vector<OpTpl*,std::allocator<OpTpl*>> *)vn1->ops + 8),
             (__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>)
             (vn2->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>)
             (vn2->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pvVar1 = vn2->ops;
  ppOVar2 = (pvVar1->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppOVar2) {
    (pvVar1->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppOVar2;
  }
  this_00 = (OpTpl *)operator_new(0x28);
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->opc = opc;
  this_00->output = (VarnodeTpl *)0x0;
  op = this_00;
  OpTpl::addInput(this_00,vn1->outvn);
  OpTpl::addInput(this_00,vn2->outvn);
  vn2->outvn = (VarnodeTpl *)0x0;
  this_00->output = outvn;
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(vn1->ops,&op);
  this_01 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_01,outvn);
  vn1->outvn = this_01;
  ExprTree::~ExprTree(vn2);
  operator_delete(vn2);
  return vn1;
}

Assistant:

ExprTree *PcodeCompile::createOpOut(VarnodeTpl *outvn,OpCode opc,
				       ExprTree *vn1,ExprTree *vn2)
{ // Create an op with explicit output and two inputs
  vn1->ops->insert(vn1->ops->end(),vn2->ops->begin(),vn2->ops->end());
  vn2->ops->clear();
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn1->outvn);
  op->addInput(vn2->outvn);
  vn2->outvn = (VarnodeTpl *)0;
  op->setOutput(outvn);
  vn1->ops->push_back(op);
  vn1->outvn = new VarnodeTpl(*outvn);
  delete vn2;
  return vn1;
}